

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

_Bool ts_stack_merge(Stack *self,StackVersion version1,StackVersion version2)

{
  _Bool _Var1;
  StackHead *pSVar2;
  StackHead *pSVar3;
  uint local_34;
  uint32_t i;
  StackHead *head2;
  StackHead *head1;
  StackVersion version2_local;
  StackVersion version1_local;
  Stack *self_local;
  
  _Var1 = ts_stack_can_merge(self,version1,version2);
  if (_Var1) {
    pSVar2 = (self->heads).contents + version1;
    pSVar3 = (self->heads).contents + version2;
    for (local_34 = 0; local_34 < pSVar3->node->link_count; local_34 = local_34 + 1) {
      stack_node_add_link(pSVar2->node,pSVar3->node->links[local_34],self->subtree_pool);
    }
    if (pSVar2->node->state == 0) {
      pSVar2->node_count_at_last_error = pSVar2->node->node_count;
    }
    ts_stack_remove_version(self,version2);
    self_local._7_1_ = true;
  }
  else {
    self_local._7_1_ = false;
  }
  return self_local._7_1_;
}

Assistant:

bool ts_stack_merge(Stack *self, StackVersion version1, StackVersion version2) {
  if (!ts_stack_can_merge(self, version1, version2)) return false;
  StackHead *head1 = &self->heads.contents[version1];
  StackHead *head2 = &self->heads.contents[version2];
  for (uint32_t i = 0; i < head2->node->link_count; i++) {
    stack_node_add_link(head1->node, head2->node->links[i], self->subtree_pool);
  }
  if (head1->node->state == ERROR_STATE) {
    head1->node_count_at_last_error = head1->node->node_count;
  }
  ts_stack_remove_version(self, version2);
  return true;
}